

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm2d.c
# Opt level: O1

void av1_highbd_iwht4x4_1_add_c(tran_low_t *in,uint8_t *dest8,int dest_stride,int bd)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  undefined2 uVar6;
  int iVar7;
  int local_38 [6];
  tran_low_t tmp [4];
  
  local_38[3] = *in >> 3;
  local_38[0] = (*in >> 2) - local_38[3];
  local_38[2] = local_38[3];
  local_38[1] = local_38[3];
  lVar1 = (long)dest_stride * 2 + (long)dest8 * 2;
  lVar2 = (long)(dest_stride * 2) * 2 + (long)dest8 * 2;
  lVar3 = (long)(dest_stride * 3) * 2 + (long)dest8 * 2;
  lVar4 = 0;
  do {
    iVar5 = local_38[lVar4] >> 1;
    iVar7 = (uint)*(ushort *)((long)dest8 * 2 + lVar4 * 2) + (local_38[lVar4] - iVar5);
    if (bd == 10) {
      if (0x3fe < iVar7) {
        iVar7 = 0x3ff;
      }
    }
    else if (bd == 0xc) {
      if (0xffe < iVar7) {
        iVar7 = 0xfff;
      }
    }
    else if (0xfe < iVar7) {
      iVar7 = 0xff;
    }
    uVar6 = (undefined2)iVar7;
    if (iVar7 < 1) {
      uVar6 = 0;
    }
    *(undefined2 *)((long)dest8 * 2 + lVar4 * 2) = uVar6;
    iVar7 = (uint)*(ushort *)(lVar1 + lVar4 * 2) + iVar5;
    if (bd == 10) {
      if (0x3fe < iVar7) {
        iVar7 = 0x3ff;
      }
    }
    else if (bd == 0xc) {
      if (0xffe < iVar7) {
        iVar7 = 0xfff;
      }
    }
    else if (0xfe < iVar7) {
      iVar7 = 0xff;
    }
    uVar6 = (undefined2)iVar7;
    if (iVar7 < 1) {
      uVar6 = 0;
    }
    *(undefined2 *)(lVar1 + lVar4 * 2) = uVar6;
    iVar7 = (uint)*(ushort *)(lVar2 + lVar4 * 2) + iVar5;
    if (bd == 10) {
      if (0x3fe < iVar7) {
        iVar7 = 0x3ff;
      }
    }
    else if (bd == 0xc) {
      if (0xffe < iVar7) {
        iVar7 = 0xfff;
      }
    }
    else if (0xfe < iVar7) {
      iVar7 = 0xff;
    }
    uVar6 = (undefined2)iVar7;
    if (iVar7 < 1) {
      uVar6 = 0;
    }
    *(undefined2 *)(lVar2 + lVar4 * 2) = uVar6;
    iVar5 = iVar5 + (uint)*(ushort *)(lVar3 + lVar4 * 2);
    if (bd == 10) {
      if (0x3fe < iVar5) {
        iVar5 = 0x3ff;
      }
    }
    else if (bd == 0xc) {
      if (0xffe < iVar5) {
        iVar5 = 0xfff;
      }
    }
    else if (0xfe < iVar5) {
      iVar5 = 0xff;
    }
    uVar6 = (undefined2)iVar5;
    if (iVar5 < 1) {
      uVar6 = 0;
    }
    *(undefined2 *)(lVar3 + lVar4 * 2) = uVar6;
    lVar4 = lVar4 + 1;
  } while ((int)lVar4 != 4);
  return;
}

Assistant:

void av1_highbd_iwht4x4_1_add_c(const tran_low_t *in, uint8_t *dest8,
                                int dest_stride, int bd) {
  int i;
  tran_low_t a1, e1;
  tran_low_t tmp[4];
  const tran_low_t *ip = in;
  tran_low_t *op = tmp;
  uint16_t *dest = CONVERT_TO_SHORTPTR(dest8);
  (void)bd;

  a1 = ip[0 * 4] >> UNIT_QUANT_SHIFT;
  e1 = a1 >> 1;
  a1 -= e1;
  op[0] = a1;
  op[1] = op[2] = op[3] = e1;

  ip = tmp;
  for (i = 0; i < 4; i++) {
    e1 = ip[0] >> 1;
    a1 = ip[0] - e1;
    dest[dest_stride * 0] =
        highbd_clip_pixel_add(dest[dest_stride * 0], a1, bd);
    dest[dest_stride * 1] =
        highbd_clip_pixel_add(dest[dest_stride * 1], e1, bd);
    dest[dest_stride * 2] =
        highbd_clip_pixel_add(dest[dest_stride * 2], e1, bd);
    dest[dest_stride * 3] =
        highbd_clip_pixel_add(dest[dest_stride * 3], e1, bd);
    ip++;
    dest++;
  }
}